

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunctionType.cpp
# Opt level: O1

ScriptFunctionType * Js::ScriptFunctionType::New(FunctionProxy *proxy,bool isShared)

{
  Type TVar1;
  JavascriptLibrary *this;
  FunctionInfo *pFVar2;
  DynamicObject *prototype;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  ScriptContext *pSVar6;
  undefined4 *puVar7;
  undefined4 extraout_var;
  DynamicTypeHandler *typeHandler;
  ScriptFunctionType *pSVar8;
  Type *pTVar9;
  
  pSVar6 = FunctionProxy::GetScriptContext(proxy);
  this = (pSVar6->super_ScriptContextBase).javascriptLibrary;
  if ((proxy->functionInfo).ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4ea,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_00de182e;
    *puVar7 = 0;
  }
  if ((((proxy->functionInfo).ptr)->functionBodyImpl).ptr != proxy) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4eb,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar4) goto LAB_00de182e;
    *puVar7 = 0;
  }
  pFVar2 = (proxy->functionInfo).ptr;
  pTVar9 = &(this->super_JavascriptLibraryBase).asyncFunctionPrototype;
  if ((pFVar2->attributes & Async) == None) {
    pTVar9 = &(this->super_JavascriptLibraryBase).functionPrototype;
  }
  prototype = pTVar9->ptr;
  if (pFVar2 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4f8,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_00de182e;
    *puVar7 = 0;
  }
  if ((((proxy->functionInfo).ptr)->functionBodyImpl).ptr != proxy) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4f9,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar4) {
LAB_00de182e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  TVar1 = ((proxy->functionInfo).ptr)->attributes;
  iVar5 = (*(proxy->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[7])(proxy);
  typeHandler = JavascriptLibrary::ScriptFunctionTypeHandler
                          (this,(bool)((byte)TVar1 & 1),
                           (char16 *)CONCAT44(extraout_var,iVar5) == L"Anonymous function");
  pSVar8 = New(proxy,typeHandler,&prototype->super_RecyclableObject,isShared);
  return pSVar8;
}

Assistant:

ScriptFunctionType * ScriptFunctionType::New(FunctionProxy * proxy, bool isShared)
    {
        ScriptContext * scriptContext = proxy->GetScriptContext();
        JavascriptLibrary * library = scriptContext->GetLibrary();
        DynamicObject * functionPrototype = proxy->IsAsync() ? library->GetAsyncFunctionPrototype() : library->GetFunctionPrototype();
        DynamicTypeHandler * typeHandler = library->ScriptFunctionTypeHandler(!proxy->IsConstructor(), proxy->GetIsAnonymousFunction());

        return New(proxy, typeHandler, functionPrototype, isShared);
    }